

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O2

object_ptr mjs::make_array(gc_heap_ptr<mjs::global_object> *global,uint32_t length)

{
  undefined8 extraout_RDX;
  object_ptr oVar1;
  gc_heap_ptr_untyped local_20;
  
  array_object::make((gc_heap_ptr<mjs::global_object> *)&local_20,length);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&global->super_gc_heap_ptr_untyped,&local_20);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_20);
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)global;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr make_array(const gc_heap_ptr<global_object>& global, uint32_t length) {
    return array_object::make(global, length);
}